

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

void HighsHashTree<int,HighsImplications::VarBound>::mergeIntoLeaf<2,1>
               (InnerLeaf<2> *leaf,InnerLeaf<1> *mergeLeaf,int hashPos)

{
  Entry *entry;
  long lVar1;
  
  if (0 < mergeLeaf->size) {
    entry = (mergeLeaf->entries)._M_elems;
    lVar1 = 0;
    do {
      HighsHashTree<int,_HighsImplications::VarBound>::InnerLeaf<2>::insert_entry
                (leaf,(ulong)(uint)entry->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
                      (ulong)(uint)entry->key_ * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32,hashPos,
                 entry);
      lVar1 = lVar1 + 1;
      entry = entry + 1;
    } while (lVar1 < mergeLeaf->size);
  }
  return;
}

Assistant:

static void mergeIntoLeaf(InnerLeaf<SizeClass1>* leaf,
                            InnerLeaf<SizeClass2>* mergeLeaf, int hashPos) {
    for (int i = 0; i < mergeLeaf->size; ++i)
      leaf->insert_entry(compute_hash(mergeLeaf->entries[i].key()), hashPos,
                         mergeLeaf->entries[i]);
  }